

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_mesh.cpp
# Opt level: O2

void __thiscall ON_MeshTopology::Dump(ON_MeshTopology *this,ON_TextLog *dump)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  int iVar4;
  ON_3fPoint *pOVar5;
  ON_MeshTopologyEdge *pOVar6;
  ON_MeshTopologyFace *pOVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  long lVar11;
  ON_MeshTopologyVertex *pOVar12;
  long lVar13;
  
  uVar1 = (this->m_topv).m_count;
  uVar2 = (this->m_tope).m_count;
  uVar3 = (this->m_topf).m_count;
  uVar8 = (ulong)uVar3;
  uVar10 = (ulong)uVar1;
  if ((int)uVar1 < 1) {
    uVar10 = 0;
  }
  for (uVar9 = 0; uVar9 != uVar10; uVar9 = uVar9 + 1) {
    pOVar12 = (this->m_topv).m_a + uVar9;
    ON_TextLog::Print(dump,"topv %d: ");
    if (this->m_mesh != (ON_Mesh *)0x0) {
      iVar4 = *pOVar12->m_vi;
      pOVar5 = (this->m_mesh->m_V).super_ON_SimpleArray<ON_3fPoint>.m_a;
      ON_TextLog::Print(dump,"{%g,%g,%g} ",(double)pOVar5[iVar4].x,(double)pOVar5[iVar4].y,
                        (double)pOVar5[iVar4].z);
    }
    ON_TextLog::Print(dump,"(");
    for (lVar11 = 0; lVar11 < pOVar12->m_v_count; lVar11 = lVar11 + 1) {
      if (lVar11 != 0) {
        ON_TextLog::Print(dump,",");
      }
      ON_TextLog::Print(dump,"m_V[%d]",(ulong)(uint)pOVar12->m_vi[lVar11]);
    }
    ON_TextLog::Print(dump,") (");
    for (lVar11 = 0; lVar11 < pOVar12->m_tope_count; lVar11 = lVar11 + 1) {
      if (lVar11 != 0) {
        ON_TextLog::Print(dump,",");
      }
      ON_TextLog::Print(dump,"%d",(ulong)(uint)pOVar12->m_topei[lVar11]);
    }
    ON_TextLog::Print(dump,")\n");
  }
  uVar10 = (ulong)uVar2;
  if ((int)uVar2 < 1) {
    uVar10 = 0;
  }
  for (uVar9 = 0; uVar9 != uVar10; uVar9 = uVar9 + 1) {
    pOVar6 = (this->m_tope).m_a;
    ON_TextLog::Print(dump,"tope %d: topv%d to topvv%d (",uVar9 & 0xffffffff,
                      (ulong)(uint)pOVar6[uVar9].m_topvi[0],(ulong)(uint)pOVar6[uVar9].m_topvi[1]);
    for (lVar11 = 0; lVar11 < pOVar6[uVar9].m_topf_count; lVar11 = lVar11 + 1) {
      if (lVar11 != 0) {
        ON_TextLog::Print(dump,",");
      }
      ON_TextLog::Print(dump,"f%d",(ulong)(uint)pOVar6[uVar9].m_topfi[lVar11]);
    }
    ON_TextLog::Print(dump,")\n");
  }
  if ((int)uVar3 < 1) {
    uVar8 = 0;
  }
  lVar11 = 0;
  uVar10 = 0;
  do {
    if (uVar10 == uVar8) {
      return;
    }
    pOVar7 = (this->m_topf).m_a;
    ON_TextLog::Print(dump,"topf %d: (");
    for (lVar13 = 0; lVar13 != 4; lVar13 = lVar13 + 1) {
      if ((int)lVar13 != 0) {
        if (((int)lVar13 == 3) && (pOVar7[uVar10].m_topei[3] == pOVar7[uVar10].m_topei[2])) break;
        ON_TextLog::Print(dump,",");
      }
      ON_TextLog::Print(dump,"%ce%d",
                        (ulong)((uint)(pOVar7->m_reve[lVar13 + lVar11] != '\0') * 2 + 0x2b),
                        (ulong)*(uint *)((long)pOVar7->m_topei + lVar13 * 4 + lVar11));
    }
    ON_TextLog::Print(dump,")\n");
    uVar10 = uVar10 + 1;
    lVar11 = lVar11 + 0x14;
  } while( true );
}

Assistant:

void ON_MeshTopology::Dump( ON_TextLog& dump ) const
{
  ON_3fPoint p;
  int vi, ei, fi, j;
  const int topv_count = m_topv.Count();
  const int tope_count = m_tope.Count();
  const int topf_count = m_topf.Count();

  // topological vertex information
  for ( vi = 0; vi < topv_count; vi++ ) {
    const ON_MeshTopologyVertex& v = m_topv[vi];
    dump.Print("topv %d: ",vi);
    if (m_mesh) {
      // dump geometric location of this vertex
      p = m_mesh->m_V[v.m_vi[0]];
      dump.Print("{%g,%g,%g} ", p.x, p.y, p.z);
    }

    // list all mesh geometry vertices that are coincident with this
    // topological vertex
    dump.Print("(");
    for ( j = 0; j < v.m_v_count; j++ ) {
      if ( j )
        dump.Print(",");
      dump.Print("m_V[%d]",v.m_vi[j]);
    }

    // list all topological edges that begin/end at this topological vertex
    dump.Print(") (");
    for ( j = 0; j < v.m_tope_count; j++ ) {
      if ( j )
        dump.Print(",");
      dump.Print("%d",v.m_topei[j]);
    }
    dump.Print(")\n");
  }

  // topological edge information
  for ( ei = 0; ei < tope_count; ei++ ) {
    const ON_MeshTopologyEdge& e = m_tope[ei];
    dump.Print("tope %d: topv%d to topvv%d (", ei, e.m_topvi[0], e.m_topvi[1] );
    // list all mesh topological faces attached to this topological edge
    for ( j = 0; j < e.m_topf_count; j++ ) {
      if (j)
        dump.Print(",");
      dump.Print("f%d",e.m_topfi[j]);
    }
    dump.Print(")\n");
  }

  // topological face information
  // mesh m_F[] index = mesh topology m_topf[] index
  for ( fi = 0; fi < topf_count; fi++ ) {
    const ON_MeshTopologyFace& f = m_topf[fi];
    dump.Print("topf %d: (",fi);
    for ( j = 0; j < 4; j++ ) {
      if ( j == 3 && f.m_topei[3] == f.m_topei[2] )
        break; // triangular face
      if (j)
        dump.Print(",");
      dump.Print("%ce%d",f.m_reve[j]?'-':'+',f.m_topei[j]);
    }
    dump.Print(")\n");
  }
}